

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O3

void __thiscall
RVO::KdTree::buildAgentTreeRecursive(KdTree *this,size_t begin,size_t end,size_t node)

{
  float *pfVar1;
  long lVar2;
  Agent *pAVar3;
  pointer ppAVar4;
  pointer pAVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  float fVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  Vector2 VVar12;
  Vector2 VVar15;
  
  pAVar5 = (this->agentTree_).
           super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pAVar5[node].begin = begin;
    pAVar5[node].end = end;
    ppAVar4 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    VVar12 = ppAVar4[begin]->position_;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = VVar12.x_;
    auVar17._4_4_ = VVar12.y_;
    pAVar5[node].minX = VVar12.x_;
    pAVar5[node].maxX = VVar12.x_;
    pAVar5[node].maxY = VVar12.y_;
    uVar6 = begin + 1;
    auVar14._8_8_ = 0;
    auVar14._0_4_ = VVar12.x_;
    auVar14._4_4_ = VVar12.y_;
    VVar15 = VVar12;
    if (uVar6 < end) {
      do {
        VVar12 = ppAVar4[uVar6]->position_;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = VVar12.x_;
        auVar13._4_4_ = VVar12.y_;
        auVar16._8_8_ = 0;
        auVar16._0_4_ = VVar12.x_;
        auVar16._4_4_ = VVar12.y_;
        auVar17 = maxps(auVar16,auVar17);
        VVar15 = auVar17._0_8_;
        auVar14 = minps(auVar13,auVar14);
        VVar12 = auVar14._0_8_;
        uVar6 = uVar6 + 1;
      } while (end != uVar6);
      pAVar5[node].minX = auVar14._0_4_;
      pAVar5[node].maxX = VVar15.x_;
      pAVar5[node].maxY = VVar15.y_;
    }
    fVar11 = VVar12.y_;
    pAVar5[node].minY = fVar11;
    if (end - begin < 0xb) {
      return;
    }
    fVar18 = VVar15.x_ - VVar12.x_;
    fVar19 = VVar15.y_ - fVar11;
    uVar10 = -(uint)(fVar19 < fVar18);
    fVar11 = (float)(~uVar10 & (uint)(VVar15.y_ + fVar11) | uVar10 & (uint)(VVar15.x_ + VVar12.x_))
             * 0.5;
    sVar9 = begin;
    if (begin < end) {
      ppAVar4 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar2 = (ulong)(fVar18 <= fVar19) * 4;
      sVar7 = end;
      do {
        uVar6 = sVar9;
        uVar8 = sVar9 + 1;
        if (sVar9 + 1 < sVar7) {
          uVar8 = sVar7;
        }
        do {
          pfVar1 = (float *)((long)&(ppAVar4[uVar6]->position_).x_ + lVar2);
          sVar9 = uVar6;
          if (fVar11 < *pfVar1 || fVar11 == *pfVar1) break;
          uVar6 = uVar6 + 1;
          sVar9 = uVar8;
        } while (uVar8 != uVar6);
        if (sVar9 < sVar7) {
          while( true ) {
            sVar7 = sVar7 - 1;
            if (*(float *)((long)&(ppAVar4[sVar7]->position_).x_ + lVar2) < fVar11) break;
            if (sVar7 <= sVar9) goto LAB_00107550;
          }
          pAVar3 = ppAVar4[sVar9];
          ppAVar4[sVar9] = ppAVar4[sVar7];
          ppAVar4[sVar7] = pAVar3;
          sVar9 = sVar9 + 1;
          ppAVar4 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
      } while (sVar9 < sVar7);
LAB_00107550:
      pAVar5 = (this->agentTree_).
               super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    sVar9 = (sVar9 == begin) + sVar9;
    pAVar5[node].left = node + 1;
    pAVar5[node].right = node + (sVar9 - begin) * 2;
    buildAgentTreeRecursive(this,begin,sVar9,node + 1);
    pAVar5 = (this->agentTree_).
             super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    node = pAVar5[node].right;
    begin = sVar9;
  } while( true );
}

Assistant:

void KdTree::buildAgentTreeRecursive(size_t begin, size_t end, size_t node)
	{
		agentTree_[node].begin = begin;
		agentTree_[node].end = end;
		agentTree_[node].minX = agentTree_[node].maxX = agents_[begin]->position_.x();
		agentTree_[node].minY = agentTree_[node].maxY = agents_[begin]->position_.y();

		for (size_t i = begin + 1; i < end; ++i) {
			agentTree_[node].maxX = std::max(agentTree_[node].maxX, agents_[i]->position_.x());
			agentTree_[node].minX = std::min(agentTree_[node].minX, agents_[i]->position_.x());
			agentTree_[node].maxY = std::max(agentTree_[node].maxY, agents_[i]->position_.y());
			agentTree_[node].minY = std::min(agentTree_[node].minY, agents_[i]->position_.y());
		}

		if (end - begin > MAX_LEAF_SIZE) {
			/* No leaf node. */
			const bool isVertical = (agentTree_[node].maxX - agentTree_[node].minX > agentTree_[node].maxY - agentTree_[node].minY);
			const float splitValue = (isVertical ? 0.5f * (agentTree_[node].maxX + agentTree_[node].minX) : 0.5f * (agentTree_[node].maxY + agentTree_[node].minY));

			size_t left = begin;
			size_t right = end;

			while (left < right) {
				while (left < right && (isVertical ? agents_[left]->position_.x() : agents_[left]->position_.y()) < splitValue) {
					++left;
				}

				while (right > left && (isVertical ? agents_[right - 1]->position_.x() : agents_[right - 1]->position_.y()) >= splitValue) {
					--right;
				}

				if (left < right) {
					std::swap(agents_[left], agents_[right - 1]);
					++left;
					--right;
				}
			}

			if (left == begin) {
				++left;
				++right;
			}

			agentTree_[node].left = node + 1;
			agentTree_[node].right = node + 2 * (left - begin);

			buildAgentTreeRecursive(begin, left, agentTree_[node].left);
			buildAgentTreeRecursive(left, end, agentTree_[node].right);
		}
	}